

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

IReporter *
doctest::detail::reporterCreator<doctest::(anonymous_namespace)::JUnitReporter>(ContextOptions *o)

{
  IReporter *pIVar1;
  
  pIVar1 = (IReporter *)operator_new(0xd0);
  pIVar1->_vptr_IReporter = (_func_int **)&PTR_report_query_00123aa8;
  anon_unknown_14::XmlWriter::XmlWriter((XmlWriter *)(pIVar1 + 1),o->cout);
  pIVar1[0x16]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x17]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x14]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x15]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x12]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x13]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x10]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x11]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xe]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xf]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xc]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xd]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[10]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0xb]._vptr_IReporter = (_func_int **)0x0;
  pIVar1[0x18]._vptr_IReporter = (_func_int **)o;
  pIVar1[0x19]._vptr_IReporter = (_func_int **)0x0;
  return pIVar1;
}

Assistant:

IReporter* reporterCreator(const ContextOptions& o) {
        return new Reporter(o);
    }